

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O2

port_mapping_t __thiscall
libtorrent::upnp::add_mapping
          (upnp *this,portmap_protocol p,int external_port,endpoint *param_3,string *device)

{
  pointer pgVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  _Base_ptr p_Var8;
  endpoint *ep;
  long lVar9;
  port_mapping_t i;
  pointer pgVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double __x;
  undefined1 local_78 [32];
  undefined8 local_58;
  _Alloc_hider _Stack_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_40;
  
  iVar5 = (*this->m_callback->_vptr_portmap_callback[1])(this->m_callback,1);
  __x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  if ((char)iVar5 != '\0') {
    aux::print_endpoint_abi_cxx11_((string *)local_78,(aux *)param_3,ep);
    log(this,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    __x = (double)::std::__cxx11::string::~string((string *)local_78);
  }
  if (this->m_disabled != false) {
    return (port_mapping_t)-1;
  }
  pgVar10 = (this->m_mappings).
            super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            .
            super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pgVar1 = (this->m_mappings).
           super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
           .
           super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pgVar1 - (long)pgVar10;
  uVar6 = lVar9 / 0x48;
  for (lVar7 = (long)uVar6 >> 2; 0 < lVar7; lVar7 = lVar7 + -1) {
    if (pgVar10->protocol == none) goto LAB_00331834;
    if (pgVar10[1].protocol == none) {
      pgVar10 = pgVar10 + 1;
      goto LAB_00331834;
    }
    if (pgVar10[2].protocol == none) {
      pgVar10 = pgVar10 + 2;
      goto LAB_00331834;
    }
    if (pgVar10[3].protocol == none) {
      pgVar10 = pgVar10 + 3;
      goto LAB_00331834;
    }
    pgVar10 = pgVar10 + 4;
    lVar9 = lVar9 + -0x120;
  }
  lVar9 = lVar9 / 0x48;
  if (lVar9 == 1) {
LAB_00331814:
    if (pgVar10->protocol != none) {
      pgVar10 = pgVar1;
    }
LAB_00331834:
    if (pgVar10 != pgVar1) goto LAB_003318af;
  }
  else {
    if (lVar9 == 2) {
LAB_0033180a:
      if (pgVar10->protocol != none) {
        pgVar10 = pgVar10 + 1;
        goto LAB_00331814;
      }
      goto LAB_00331834;
    }
    if (lVar9 == 3) {
      if (pgVar10->protocol != none) {
        pgVar10 = pgVar10 + 1;
        goto LAB_0033180a;
      }
      goto LAB_00331834;
    }
  }
  if (0x31 < uVar6) {
    log(this,__x);
    return (port_mapping_t)-1;
  }
  local_78._0_8_ = (pointer)0x0;
  local_58 = 0;
  local_48 = 0;
  local_78._16_8_ = 0;
  local_78._24_8_ = 0;
  aStack_40._8_8_ = 0;
  local_78._8_8_ = 2;
  _Stack_50._M_p = (pointer)&aStack_40;
  aStack_40._M_allocated_capacity = 0;
  ::std::
  vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>::
  emplace_back<libtorrent::upnp::global_mapping_t>
            (&(this->m_mappings).
              super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
             ,(global_mapping_t *)local_78);
  ::std::__cxx11::string::~string((string *)&_Stack_50);
  pgVar10 = (this->m_mappings).
            super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            .
            super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
            ._M_impl.super__Vector_impl_data._M_finish + -1;
LAB_003318af:
  pgVar10->protocol = p;
  pgVar10->external_port = external_port;
  uVar2 = *(undefined8 *)((long)&(param_3->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0xc);
  uVar4 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0x14);
  *(undefined8 *)&(pgVar10->local_ep).impl_.data_ = *(undefined8 *)&(param_3->impl_).data_;
  *(undefined8 *)((long)&(pgVar10->local_ep).impl_.data_ + 8) = uVar2;
  *(undefined8 *)((long)&(pgVar10->local_ep).impl_.data_ + 0xc) = uVar3;
  *(undefined8 *)((long)&(pgVar10->local_ep).impl_.data_ + 0x14) = uVar4;
  ::std::__cxx11::string::_M_assign((string *)&pgVar10->device);
  i.m_val = (int)(((long)pgVar10 -
                  (long)(this->m_mappings).
                        super_vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                        .
                        super__Vector_base<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  for (p_Var8 = (this->m_devices)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != &(this->m_devices)._M_t._M_impl.super__Rb_tree_header;
      p_Var8 = (_Base_ptr)::std::_Rb_tree_increment(p_Var8)) {
    if (*(byte *)((long)&p_Var8[8]._M_color + 2) == 0) {
      lVar7 = *(long *)(p_Var8 + 4);
      if ((int)(((long)p_Var8[4]._M_parent - lVar7) / 0x58) <= i.m_val) {
        aux::
        container_wrapper<libtorrent::upnp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::mapping_t,std::allocator<libtorrent::upnp::mapping_t>>>
        ::resize<int,void>((container_wrapper<libtorrent::upnp::mapping_t,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>,std::vector<libtorrent::upnp::mapping_t,std::allocator<libtorrent::upnp::mapping_t>>>
                            *)(p_Var8 + 4),i.m_val + 1);
        lVar7 = *(long *)(p_Var8 + 4);
      }
      lVar7 = lVar7 + (long)i.m_val * 0x58;
      *(undefined1 *)(lVar7 + 8) = 1;
      *(portmap_protocol *)(lVar7 + 0x10) = p;
      *(int *)(lVar7 + 0xc) = external_port;
      uVar2 = *(undefined8 *)((long)&(param_3->impl_).data_ + 8);
      uVar3 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0xc);
      uVar4 = *(undefined8 *)((long)&(param_3->impl_).data_ + 0x14);
      *(undefined8 *)(lVar7 + 0x14) = *(undefined8 *)&(param_3->impl_).data_;
      *(undefined8 *)(lVar7 + 0x1c) = uVar2;
      *(undefined8 *)(lVar7 + 0x20) = uVar3;
      *(undefined8 *)(lVar7 + 0x28) = uVar4;
      ::std::__cxx11::string::_M_assign((string *)(lVar7 + 0x30));
      if (p_Var8[3]._M_parent != (_Base_ptr)0x0) {
        update_map(this,(rootdevice *)(p_Var8 + 1),i);
      }
    }
  }
  return (port_mapping_t)i.m_val;
}

Assistant:

port_mapping_t upnp::add_mapping(portmap_protocol const p, int const external_port
	, tcp::endpoint const local_ep, std::string const& device)
{
	TORRENT_ASSERT(is_single_thread());
	// external port 0 means _every_ port
	TORRENT_ASSERT(external_port != 0);

#ifndef TORRENT_DISABLE_LOGGING
	if (should_log())
	{
		log("adding port map: [ protocol: %s ext_port: %d "
			"local_ep: %s device: %s] %s", (p == portmap_protocol::tcp?"tcp":"udp")
			, external_port
			, print_endpoint(local_ep).c_str(), device.c_str()
			, m_disabled ? "DISABLED": "");
	}
#endif
	if (m_disabled) return port_mapping_t{-1};

	auto mapping_it = std::find_if(m_mappings.begin(), m_mappings.end()
		, [](global_mapping_t const& m) { return m.protocol == portmap_protocol::none; });

	if (mapping_it == m_mappings.end())
	{
		TORRENT_ASSERT(m_mappings.size() <= max_global_mappings);
		if (m_mappings.size() >= max_global_mappings)
		{
#ifndef TORRENT_DISABLE_LOGGING
			log("too many mappings registered");
#endif
			return port_mapping_t{-1};
		}
		m_mappings.push_back(global_mapping_t());
		mapping_it = m_mappings.end() - 1;
	}

	mapping_it->protocol = p;
	mapping_it->external_port = external_port;
	mapping_it->local_ep = local_ep;
	mapping_it->device = device;

	port_mapping_t const mapping_index{static_cast<int>(mapping_it - m_mappings.begin())};

	for (auto const& dev : m_devices)
	{
		auto& d = const_cast<rootdevice&>(dev);
		TORRENT_ASSERT(d.magic == 1337);
		if (d.disabled) continue;

		if (d.mapping.end_index() <= mapping_index)
			d.mapping.resize(static_cast<int>(mapping_index) + 1);
		mapping_t& m = d.mapping[mapping_index];

		m.act = portmap_action::add;
		m.protocol = p;
		m.external_port = external_port;
		m.local_ep = local_ep;
		m.device = device;

		if (!d.service_namespace.empty()) update_map(d, mapping_index);
	}

	return port_mapping_t{mapping_index};
}